

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::TryConsumeWhitespace(ParserImpl *this)

{
  bool bVar1;
  __type_conflict1 _Var2;
  Token *pTVar3;
  AlphaNum *in_RCX;
  AlphaNum local_98;
  AlphaNum local_68;
  string local_38;
  ParserImpl *local_18;
  ParserImpl *this_local;
  
  this->had_silent_marker_ = false;
  local_18 = this;
  bVar1 = LookingAtType(this,TYPE_WHITESPACE);
  if (bVar1) {
    pTVar3 = io::Tokenizer::current(&this->tokenizer_);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_68," ");
    absl::lts_20250127::AlphaNum::AlphaNum(&local_98,"\t ");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_38,(lts_20250127 *)&local_68,&local_98,in_RCX);
    _Var2 = std::operator==(&pTVar3->text,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (_Var2) {
      this->had_silent_marker_ = true;
    }
    io::Tokenizer::Next(&this->tokenizer_);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TryConsumeWhitespace() {
    had_silent_marker_ = false;
    if (LookingAtType(io::Tokenizer::TYPE_WHITESPACE)) {
      if (tokenizer_.current().text ==
          absl::StrCat(" ", internal::kDebugStringSilentMarkerForDetection)) {
        had_silent_marker_ = true;
      }
      tokenizer_.Next();
      return true;
    }
    return false;
  }